

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateBuilderMembers
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  string_view end_varname_06;
  string_view end_varname_07;
  Printer *pPVar2;
  bool bVar3;
  JavaType JVar4;
  FieldDescriptor *pFVar5;
  Options *pOVar6;
  undefined1 uVar7;
  Semantic local_52c;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_528;
  string_view local_520;
  string_view local_510;
  string_view local_500;
  FieldDescriptor local_4f0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_498;
  basic_string_view<char,_std::char_traits<char>_> local_490;
  string_view local_480;
  string_view local_470;
  FieldDescriptor local_460;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_408;
  basic_string_view<char,_std::char_traits<char>_> local_400;
  string_view local_3f0;
  string_view local_3e0;
  Semantic local_3cc;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3c8;
  string_view local_3c0;
  string_view local_3b0;
  string_view local_3a0;
  FieldDescriptor local_390;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_338;
  basic_string_view<char,_std::char_traits<char>_> local_330;
  string_view local_320;
  string_view local_310;
  FieldDescriptor local_300;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  string_view local_290;
  string_view local_280;
  Semantic local_26c;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  string_view local_250;
  string_view local_240;
  FieldDescriptor local_230;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  string_view local_1c0;
  string_view local_1b0;
  FieldDescriptor local_1a0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  string_view local_130;
  string_view local_120;
  FieldDescriptor *local_110;
  FieldDescriptor *value;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  string_view local_e8;
  string_view local_d8 [2];
  FieldDescriptor local_b8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  pFVar5 = MapValueField(this->descriptor_);
  JVar4 = GetJavaType(pFVar5);
  pPVar1 = local_18;
  if (JVar4 == JAVATYPE_MESSAGE) {
    GenerateMessageMapBuilderMembers(this,local_18);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "private com.google.protobuf.MapField<\n    $type_parameters$> $name$_;\n$deprecation$private com.google.protobuf.MapField<$type_parameters$>\n    internalGet$capitalized_name$() {\n  if ($name$_ == null) {\n    return com.google.protobuf.MapField.emptyMapField(\n        $map_field_parameter$);\n  }\n  return $name$_;\n}\n$deprecation$private com.google.protobuf.MapField<$type_parameters$>\n    internalGetMutable$capitalized_name$() {\n  if ($name$_ == null) {\n    $name$_ = com.google.protobuf.MapField.newMapField(\n        $map_field_parameter$);\n  }\n  if (!$name$_.isMutable()) {\n    $name$_ = $name$_.copy();\n  }\n  $set_has_field_bit_builder$\n  $on_changed$\n  return $name$_;\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar1,&this->variables_,local_28);
    GenerateMapGetters(this,local_18);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $clear_has_field_bit_builder$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .clear();\n  return this;\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar1,&this->variables_,local_38);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"}");
    pFVar5 = this->descriptor_;
    local_b8.field_20.default_value_int64_t_._4_4_ = 1;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
    optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
              (&local_60,(Semantic *)((long)&local_b8.field_20 + 4));
    end_varname_07._M_str = local_58._M_str;
    end_varname_07._M_len = local_58._M_len;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar1,local_48,end_varname_07,pFVar5,local_60);
    pPVar2 = local_18;
    uVar7 = SUB81(local_58._M_str,0);
    pPVar1 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    java::Options::Options((Options *)&local_b8,pOVar6);
    WriteFieldDocComment((java *)pPVar2,pPVar1,&local_b8,(Options *)0x0,(bool)uVar7);
    java::Options::~Options((Options *)&local_b8);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_d8,
               "$deprecation$public Builder ${$remove$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .remove(key);\n  return this;\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar1,&this->variables_,local_d8[0]);
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"}");
    pFVar5 = this->descriptor_;
    value._4_4_ = 1;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
    optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
              (&local_100,(Semantic *)((long)&value + 4));
    end_varname_06._M_str = local_f8._M_str;
    end_varname_06._M_len = local_f8._M_len;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar1,local_e8,end_varname_06,pFVar5,local_100);
    uVar7 = SUB81(local_f8._M_str,0);
    local_110 = MapValueField(this->descriptor_);
    JVar4 = GetJavaType(local_110);
    if (JVar4 == JAVATYPE_ENUM) {
      pOVar6 = Context::options(this->context_);
      pPVar1 = local_18;
      if ((pOVar6->opensource_runtime & 1U) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_120,
                   "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\n    ${$getMutable$capitalized_name$$}$() {\n  $set_has_field_bit_builder$\n  return internalGetAdapted$capitalized_name$Map(\n       internalGetMutable$capitalized_name$().getMutableMap());\n}\n"
                  );
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (pPVar1,&this->variables_,local_120);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"{");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_140,"}");
        pFVar5 = this->descriptor_;
        std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_148);
        end_varname_05._M_str = local_140._M_str;
        end_varname_05._M_len = local_140._M_len;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (pPVar1,local_130,end_varname_05,pFVar5,local_148);
        uVar7 = SUB81(local_140._M_str,0);
      }
      pPVar2 = local_18;
      pPVar1 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      java::Options::Options((Options *)&local_1a0,pOVar6);
      WriteFieldDocComment((java *)pPVar2,pPVar1,&local_1a0,(Options *)0x0,(bool)uVar7);
      java::Options::~Options((Options *)&local_1a0);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1b0,
                 "$deprecation$public Builder ${$put$capitalized_name$$}$(\n    $key_type$ key,\n    $value_enum_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .put(key, $name$ValueConverter.doBackward(value));\n  $set_has_field_bit_builder$\n  return this;\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar1,&this->variables_,local_1b0);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"}");
      pFVar5 = this->descriptor_;
      local_230.field_20.default_value_int64_t_._4_4_ = 1;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
      optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
                (&local_1d8,(Semantic *)((long)&local_230.field_20 + 4));
      end_varname_04._M_str = local_1d0._M_str;
      end_varname_04._M_len = local_1d0._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar1,local_1c0,end_varname_04,pFVar5,local_1d8);
      pPVar2 = local_18;
      uVar7 = SUB81(local_1d0._M_str,0);
      pPVar1 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      java::Options::Options((Options *)&local_230,pOVar6);
      WriteFieldDocComment((java *)pPVar2,pPVar1,&local_230,(Options *)0x0,(bool)uVar7);
      java::Options::~Options((Options *)&local_230);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_240,
                 "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n    java.util.Map<$boxed_key_type$, $value_enum_type$> values) {\n  internalGetAdapted$capitalized_name$Map(\n      internalGetMutable$capitalized_name$().getMutableMap())\n          .putAll(values);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar1,&this->variables_,local_240);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_250,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_260,"}");
      pFVar5 = this->descriptor_;
      local_26c = kSet;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
      optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_268,&local_26c);
      end_varname_03._M_str = local_260._M_str;
      end_varname_03._M_len = local_260._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar1,local_250,end_varname_03,pFVar5,local_268);
      uVar7 = SUB81(local_260._M_str,0);
      bVar3 = SupportUnknownEnumValue(local_110);
      if (bVar3) {
        pOVar6 = Context::options(this->context_);
        pPVar1 = local_18;
        if ((pOVar6->opensource_runtime & 1U) != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_280,
                     "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$getMutable$capitalized_name$Value$}$() {\n  $set_has_field_bit_builder$\n  return internalGetMutable$capitalized_name$().getMutableMap();\n}\n"
                    );
          io::Printer::
          Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    (pPVar1,&this->variables_,local_280);
          pPVar1 = local_18;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_290,"{");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0,"}");
          pFVar5 = this->descriptor_;
          std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_2a8);
          end_varname_02._M_str = local_2a0._M_str;
          end_varname_02._M_len = local_2a0._M_len;
          io::Printer::Annotate<google::protobuf::FieldDescriptor>
                    (pPVar1,local_290,end_varname_02,pFVar5,local_2a8);
          uVar7 = SUB81(local_2a0._M_str,0);
        }
        pPVar2 = local_18;
        pPVar1 = (Printer *)this->descriptor_;
        pOVar6 = Context::options(this->context_);
        java::Options::Options((Options *)&local_300,pOVar6);
        WriteFieldDocComment((java *)pPVar2,pPVar1,&local_300,(Options *)0x0,(bool)uVar7);
        java::Options::~Options((Options *)&local_300);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_310,
                   "$deprecation$public Builder ${$put$capitalized_name$Value$}$(\n    $key_type$ key,\n    $value_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .put(key, value);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
                  );
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (pPVar1,&this->variables_,local_310);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_320,"{");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"}");
        pFVar5 = this->descriptor_;
        local_390.field_20.default_value_int64_t_._4_4_ = 1;
        std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
        optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
                  (&local_338,(Semantic *)((long)&local_390.field_20 + 4));
        end_varname_01._M_str = local_330._M_str;
        end_varname_01._M_len = local_330._M_len;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (pPVar1,local_320,end_varname_01,pFVar5,local_338);
        pPVar2 = local_18;
        uVar7 = SUB81(local_330._M_str,0);
        pPVar1 = (Printer *)this->descriptor_;
        pOVar6 = Context::options(this->context_);
        java::Options::Options((Options *)&local_390,pOVar6);
        WriteFieldDocComment((java *)pPVar2,pPVar1,&local_390,(Options *)0x0,(bool)uVar7);
        java::Options::~Options((Options *)&local_390);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3a0,
                   "$deprecation$public Builder ${$putAll$capitalized_name$Value$}$(\n    java.util.Map<$boxed_key_type$, $boxed_value_type$> values) {\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .putAll(values);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
                  );
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (pPVar1,&this->variables_,local_3a0);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b0,"{");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3c0,"}");
        pFVar5 = this->descriptor_;
        local_3cc = kSet;
        std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
        optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_3c8,&local_3cc);
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (pPVar1,local_3b0,local_3c0,pFVar5,local_3c8);
      }
    }
    else {
      pOVar6 = Context::options(this->context_);
      pPVar1 = local_18;
      if ((pOVar6->opensource_runtime & 1U) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3e0,
                   "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$>\n    ${$getMutable$capitalized_name$$}$() {\n  $set_has_field_bit_builder$\n  return internalGetMutable$capitalized_name$().getMutableMap();\n}\n"
                  );
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (pPVar1,&this->variables_,local_3e0);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f0,"{");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_400,"}");
        pFVar5 = this->descriptor_;
        std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_408);
        end_varname_00._M_str = local_400._M_str;
        end_varname_00._M_len = local_400._M_len;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (pPVar1,local_3f0,end_varname_00,pFVar5,local_408);
        uVar7 = SUB81(local_400._M_str,0);
      }
      pPVar2 = local_18;
      pPVar1 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      java::Options::Options((Options *)&local_460,pOVar6);
      WriteFieldDocComment((java *)pPVar2,pPVar1,&local_460,(Options *)0x0,(bool)uVar7);
      java::Options::~Options((Options *)&local_460);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_470,
                 "$deprecation$public Builder ${$put$capitalized_name$$}$(\n    $key_type$ key,\n    $value_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .put(key, value);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar1,&this->variables_,local_470);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_480,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_490,"}");
      pFVar5 = this->descriptor_;
      local_4f0.field_20.default_value_int64_t_._4_4_ = 1;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
      optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
                (&local_498,(Semantic *)((long)&local_4f0.field_20 + 4));
      end_varname._M_str = local_490._M_str;
      end_varname._M_len = local_490._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar1,local_480,end_varname,pFVar5,local_498);
      pPVar2 = local_18;
      uVar7 = SUB81(local_490._M_str,0);
      pPVar1 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      java::Options::Options((Options *)&local_4f0,pOVar6);
      WriteFieldDocComment((java *)pPVar2,pPVar1,&local_4f0,(Options *)0x0,(bool)uVar7);
      java::Options::~Options((Options *)&local_4f0);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_500,
                 "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n    java.util.Map<$type_parameters$> values) {\n  internalGetMutable$capitalized_name$().getMutableMap()\n      .putAll(values);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar1,&this->variables_,local_500);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_510,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_520,"}");
      pFVar5 = this->descriptor_;
      local_52c = kSet;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
      optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_528,&local_52c);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar1,local_510,local_520,pFVar5,local_528);
    }
  }
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  if (GetJavaType(MapValueField(descriptor_)) == JAVATYPE_MESSAGE) {
    return GenerateMessageMapBuilderMembers(printer);
  }
  printer->Print(
      variables_,
      "private com.google.protobuf.MapField<\n"
      "    $type_parameters$> $name$_;\n"
      "$deprecation$private com.google.protobuf.MapField<$type_parameters$>\n"
      "    internalGet$capitalized_name$() {\n"
      "  if ($name$_ == null) {\n"
      "    return com.google.protobuf.MapField.emptyMapField(\n"
      "        $map_field_parameter$);\n"
      "  }\n"
      "  return $name$_;\n"
      "}\n"
      "$deprecation$private com.google.protobuf.MapField<$type_parameters$>\n"
      "    internalGetMutable$capitalized_name$() {\n"
      "  if ($name$_ == null) {\n"
      "    $name$_ = com.google.protobuf.MapField.newMapField(\n"
      "        $map_field_parameter$);\n"
      "  }\n"
      "  if (!$name$_.isMutable()) {\n"
      "    $name$_ = $name$_.copy();\n"
      "  }\n"
      "  $set_has_field_bit_builder$\n"
      "  $on_changed$\n"
      "  return $name$_;\n"
      "}\n");
  GenerateMapGetters(printer);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $clear_has_field_bit_builder$\n"
      "  internalGetMutable$capitalized_name$().getMutableMap()\n"
      "      .clear();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder ${$remove$capitalized_name$$}$(\n"
                 "    $key_type$ key) {\n"
                 "  $key_null_check$\n"
                 "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                 "      .remove(key);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  const FieldDescriptor* value = MapValueField(descriptor_);
  if (GetJavaType(value) == JAVATYPE_ENUM) {
    if (context_->options().opensource_runtime) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use alternate mutation accessors instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
          "    ${$getMutable$capitalized_name$$}$() {\n"
          "  $set_has_field_bit_builder$\n"
          "  return internalGetAdapted$capitalized_name$Map(\n"
          "       internalGetMutable$capitalized_name$().getMutableMap());\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$public Builder ${$put$capitalized_name$$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_enum_type$ value) {\n"
                   "  $key_null_check$\n"
                   "  $value_null_check$\n"
                   "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                   "      .put(key, $name$ValueConverter.doBackward(value));\n"
                   "  $set_has_field_bit_builder$\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_, Semantic::kSet);

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n"
        "    java.util.Map<$boxed_key_type$, $value_enum_type$> values) {\n"
        "  internalGetAdapted$capitalized_name$Map(\n"
        "      internalGetMutable$capitalized_name$().getMutableMap())\n"
        "          .putAll(values);\n"
        "  $set_has_field_bit_builder$\n"
        "  return this;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_, Semantic::kSet);

    if (SupportUnknownEnumValue(value)) {
      if (context_->options().opensource_runtime) {
        printer->Print(
            variables_,
            "/**\n"
            " * Use alternate mutation accessors instead.\n"
            " */\n"
            "@java.lang.Deprecated\n"
            "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
            "${$getMutable$capitalized_name$Value$}$() {\n"
            "  $set_has_field_bit_builder$\n"
            "  return internalGetMutable$capitalized_name$().getMutableMap();\n"
            "}\n");
        printer->Annotate("{", "}", descriptor_);
      }

      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "$deprecation$public Builder ${$put$capitalized_name$Value$}$(\n"
          "    $key_type$ key,\n"
          "    $value_type$ value) {\n"
          "  $key_null_check$\n"
          "  $value_null_check$\n"
          "  internalGetMutable$capitalized_name$().getMutableMap()\n"
          "      .put(key, value);\n"
          "  $set_has_field_bit_builder$\n"
          "  return this;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_, Semantic::kSet);

      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "$deprecation$public Builder ${$putAll$capitalized_name$Value$}$(\n"
          "    java.util.Map<$boxed_key_type$, $boxed_value_type$> values) {\n"
          "  internalGetMutable$capitalized_name$().getMutableMap()\n"
          "      .putAll(values);\n"
          "  $set_has_field_bit_builder$\n"
          "  return this;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_, Semantic::kSet);
    }
  } else {
    if (context_->options().opensource_runtime) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use alternate mutation accessors instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$type_parameters$>\n"
          "    ${$getMutable$capitalized_name$$}$() {\n"
          "  $set_has_field_bit_builder$\n"
          "  return internalGetMutable$capitalized_name$().getMutableMap();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$public Builder ${$put$capitalized_name$$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_type$ value) {\n"
                   "  $key_null_check$\n"
                   "  $value_null_check$\n"
                   "  internalGetMutable$capitalized_name$().getMutableMap()\n"
                   "      .put(key, value);\n"
                   "  $set_has_field_bit_builder$\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_, Semantic::kSet);

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n"
        "    java.util.Map<$type_parameters$> values) {\n"
        "  internalGetMutable$capitalized_name$().getMutableMap()\n"
        "      .putAll(values);\n"
        "  $set_has_field_bit_builder$\n"
        "  return this;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  }
}